

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  int iVar1;
  char *pcVar2;
  CURLcode CVar3;
  ulong uVar4;
  ulong uVar5;
  curl_off_t *pcVar6;
  size_t len;
  char *pcVar7;
  char numbuf [18];
  dynbuf dyn;
  char *local_80;
  char **local_78;
  curl_off_t *local_70;
  char local_68 [24];
  dynbuf local_50;
  
  *result = (char *)0x0;
  local_80 = filename;
  local_78 = result;
  curlx_dyn_init(&local_50,0x2800);
  local_70 = &glob->pattern[0].content.NumRange.ptr_n;
  pcVar7 = "";
  len = 0;
  do {
    pcVar2 = local_80;
    if (*local_80 == '#') {
      if ((((byte)(local_80[1] - 0x30U) < 10) &&
          (uVar4 = strtoul(local_80 + 1,&local_80,10), uVar4 != 0)) &&
         (uVar5 = glob->size, uVar4 < uVar5)) {
        pcVar6 = local_70;
        do {
          if (*(int *)((long)pcVar6 + -0x1c) == (int)uVar4 + -1) {
            iVar1 = *(int *)(pcVar6 + -4);
            if (iVar1 == 3) {
              pcVar7 = local_68;
              curl_msnprintf(pcVar7,0x12,"%0*ld",*(int *)(pcVar6 + -1),*pcVar6);
            }
            else {
              if (iVar1 == 2) {
                local_68[0] = *(char *)((long)pcVar6 + -0x16);
                local_68[1] = 0;
                len = 1;
                pcVar7 = local_68;
                goto LAB_0011d57a;
              }
              if (iVar1 != 1) {
                curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n");
                curlx_dyn_free(&local_50);
                return CURLE_FAILED_INIT;
              }
              if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -3))->min_n == 0)
              goto LAB_0011d57a;
              pcVar7 = *(char **)(((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -3))->min_n +
                                 (long)*(int *)(pcVar6 + -1) * 8);
            }
            len = strlen(pcVar7);
            goto LAB_0011d57a;
          }
          pcVar6 = pcVar6 + 6;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
    else if (*local_80 == '\0') {
      CVar3 = curlx_dyn_addn(&local_50,"",0);
      if (CVar3 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar7 = curlx_dyn_ptr(&local_50);
      *local_78 = pcVar7;
      return CURLE_OK;
    }
    local_80 = pcVar2 + 1;
    len = 1;
    pcVar7 = pcVar2;
LAB_0011d57a:
    CVar3 = curlx_dyn_addn(&local_50,pcVar7,len);
    if (CVar3 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, struct URLGlob *glob)
{
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      struct URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}